

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,PointerType *type)

{
  uint uVar1;
  Type *type_00;
  uint local_24;
  
  uVar1 = Type::getAddressSpace(&type->super_Type);
  type_00 = PointerType::getElementType(type);
  if (uVar1 != 0) {
    Type::getAddressSpace(&type->super_Type);
    append(this,type_00);
    append<char_const(&)[12],unsigned_int,char_const(&)[3]>
              (this,(char (*) [12])" addrspace(",&local_24,(char (*) [3])")*");
    return;
  }
  append(this,type_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"*",1);
  return;
}

Assistant:

void StreamState::append(PointerType *type)
{
	if (type->getAddressSpace() != 0)
		append(type->getElementType(), " addrspace(", type->getAddressSpace(), ")*");
	else
		append(type->getElementType(), "*");
}